

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O0

bool termcolor::_internal::is_atty(ostream *stream)

{
  int iVar1;
  FILE *__stream;
  FILE *std_stream;
  ostream *stream_local;
  
  __stream = (FILE *)get_standard_stream(stream);
  if (__stream == (FILE *)0x0) {
    stream_local._7_1_ = false;
  }
  else {
    iVar1 = fileno(__stream);
    iVar1 = isatty(iVar1);
    stream_local._7_1_ = iVar1 != 0;
  }
  return stream_local._7_1_;
}

Assistant:

inline
        bool is_atty(const std::ostream& stream)
        {
            FILE* std_stream = get_standard_stream(stream);

            // Unfortunately, fileno() ends with segmentation fault
            // if invalid file descriptor is passed. So we need to
            // handle this case gracefully and assume it's not a tty
            // if standard stream is not detected, and 0 is returned.
            if (!std_stream)
                return false;

        #if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
            return ::isatty(fileno(std_stream));
        #elif defined(TERMCOLOR_OS_WINDOWS)
            return ::_isatty(_fileno(std_stream));
        #endif
        }